

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::write_decimal<unsigned_int>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
           *this,uint value)

{
  ulong uVar1;
  basic_buffer<char> *pbVar2;
  size_t sVar3;
  bool bVar4;
  byte bVar5;
  long lVar6;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar8 = 0x1f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> uVar8 == 0; uVar8 = uVar8 - 1) {
    }
  }
  uVar8 = (uVar8 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  uVar9 = (ulong)((uVar8 - (value < *(uint *)(internal::basic_data<void>::ZERO_OR_POWERS_OF_10_32 +
                                             (ulong)uVar8 * 4))) + 1);
  pbVar2 = (this->out_).container;
  sVar3 = pbVar2->size_;
  uVar1 = sVar3 + uVar9;
  if (pbVar2->capacity_ < uVar1) {
    (**pbVar2->_vptr_basic_buffer)(pbVar2,uVar1);
  }
  pbVar2->size_ = uVar1;
  pcVar7 = pbVar2->ptr_ + uVar9 + sVar3;
  uVar8 = value;
  if (99 < value) {
    do {
      value = uVar8 / 100;
      *(undefined2 *)(pcVar7 + -2) =
           *(undefined2 *)(internal::basic_data<void>::DIGITS + (ulong)(uVar8 % 100) * 2);
      pcVar7 = pcVar7 + -2;
      bVar4 = 9999 < uVar8;
      uVar8 = uVar8 / 100;
    } while (bVar4);
  }
  if (value < 10) {
    bVar5 = (byte)value | 0x30;
    lVar6 = -1;
  }
  else {
    pcVar7[-1] = internal::basic_data<void>::DIGITS[((ulong)value * 2 & 0xffffffff) + 1];
    bVar5 = internal::basic_data<void>::DIGITS[(ulong)value * 2];
    lVar6 = -2;
  }
  pcVar7[lVar6] = bVar5;
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    unsigned num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + num_digits);
    if (is_negative)
      *it++ = '-';
    it = internal::format_decimal(it, abs_value, num_digits);
  }